

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::String::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value,int width)

{
  long lVar1;
  undefined1 uVar2;
  stringstream local_1b0 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  lVar1 = *(long *)(ss._8_8_ + -0x18);
  if ((&ss.field_0xe9)[lVar1] == '\0') {
    uVar2 = std::ios::widen((char)&ss + '\b' + (char)lVar1);
    (&ss.field_0xe8)[lVar1] = uVar2;
    (&ss.field_0xe9)[lVar1] = 1;
  }
  (&ss.field_0xe8)[lVar1] = 0x30;
  *(long *)(&ss._M_stringbuf + *(long *)(ss._8_8_ + -0x18)) = (long)value;
  std::ostream::operator<<(&ss.field_0x8,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)&ss.field_0x78);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidthN(int value, int width) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(width) << value;
  return ss.str();
}